

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLoop2(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  Type *pTVar9;
  GreaterThanLayerParams *this;
  ActivationParams *pAVar10;
  ActivationReLU *this_00;
  TypeUnion this_01;
  LoopLayerParams *this_02;
  NeuralNetwork *pNVar11;
  CopyLayerParams *this_03;
  ostream *poVar12;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_04;
  Result res;
  Model m;
  NeuralNetwork nnCondition;
  NeuralNetwork nnBody;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  Model local_100;
  undefined1 local_d0 [16];
  RepeatedPtrFieldBase local_c0 [3];
  undefined1 local_78 [16];
  RepeatedPtrFieldBase local_68 [3];
  
  CoreML::Specification::Model::Model(&local_100);
  if (local_100.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_100.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_100.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d0);
  if ((RepeatedPtrFieldBase *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)((long)local_c0[0].arena_ + 1));
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 1;
  if (local_100.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_100.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_100.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d0);
  if ((RepeatedPtrFieldBase *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)((long)local_c0[0].arena_ + 1));
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_d0);
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     (local_c0,(Type *)0x0);
  if (pTVar9->_oneof_case_[0] != 0x33e) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 0x33e;
    this = (GreaterThanLayerParams *)operator_new(0x18);
    CoreML::Specification::GreaterThanLayerParams::GreaterThanLayerParams(this);
    (pTVar9->layer_).greaterthan_ = this;
  }
  (((pTVar9->layer_).convolution_)->kernelsize_).current_size_ = 0x3f800000;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"cond","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((RepeatedPtrFieldBase *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0].arena_ + 1));
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar9,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar9,"cond");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_78);
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     (local_68,(Type *)0x0);
  if (pTVar9->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 0x82;
    pAVar10 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar10);
    (pTVar9->layer_).activation_ = pAVar10;
  }
  pAVar10 = (pTVar9->layer_).activation_;
  if (pAVar10->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar10);
    pAVar10->_oneof_case_[0] = 10;
    this_00 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(this_00);
    (pAVar10->NonlinearityType_).relu_ = this_00;
  }
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"relu","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar9,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar9,"B");
  if (local_100._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_100);
    local_100._oneof_case_[0] = 500;
    this_01.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_01.neuralnetwork_);
    local_100.Type_.pipelineclassifier_ = this_01.pipelineclassifier_;
  }
  (local_100.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_04 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_100.Type_.pipeline_)->models_;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_04,(Type *)0x0);
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"for_loop","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (pTVar9->_oneof_case_[0] != 0x267) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 0x267;
    this_02 = (LoopLayerParams *)operator_new(0x38);
    CoreML::Specification::LoopLayerParams::LoopLayerParams(this_02);
    (pTVar9->layer_).loop_ = this_02;
  }
  pCVar3 = (pTVar9->layer_).convolution_;
  if (*(long *)&pCVar3->_kernelsize_cached_byte_size_ == 0) {
    pNVar11 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar11);
    *(NeuralNetwork **)&pCVar3->_kernelsize_cached_byte_size_ = pNVar11;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            (*(NeuralNetwork **)&pCVar3->_kernelsize_cached_byte_size_,(NeuralNetwork *)local_78);
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pNVar11 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar11);
    (pCVar3->kernelsize_).rep_ = (Rep *)pNVar11;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            ((NeuralNetwork *)(pCVar3->kernelsize_).rep_,(NeuralNetwork *)local_d0);
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_04,(Type *)0x0);
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"copy","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar9,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar9,"B");
  if (pTVar9->_oneof_case_[0] != 600) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 600;
    this_03 = (CopyLayerParams *)operator_new(0x18);
    CoreML::Specification::CopyLayerParams::CopyLayerParams(this_03);
    (pTVar9->layer_).copy_ = this_03;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_128,&local_100);
  bVar4 = CoreML::Result::good((Result *)local_128);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._8_8_ != &local_110) {
    operator_delete((void *)local_128._8_8_,local_110._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_78);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_d0);
  CoreML::Specification::Model::~Model(&local_100);
  return (uint)bVar4;
}

Assistant:

int testInvalidLoop2() {
    /*
     condition network present but no condition variable
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");
    
    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);
    
    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}